

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

int __thiscall
table::select_abi_cxx11_
          (table *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  column *this_00;
  Expr *pEVar1;
  char *pcVar2;
  bool bVar3;
  size_type sVar4;
  reference ppEVar5;
  vector<column_*,_std::allocator<column_*>_> *this_01;
  reference ppcVar6;
  reference ppEVar7;
  ostream *poVar8;
  undefined4 in_register_00000034;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
  local_130;
  uint local_104;
  undefined1 local_100 [32];
  column *local_e0;
  column *col_1;
  string local_d0 [8];
  string colName;
  Expr *expr;
  iterator __end2_1;
  iterator __begin2_1;
  vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_> *__range2_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
  local_80;
  column *local_58;
  column *col;
  iterator __end2;
  iterator __begin2;
  vector<column_*,_std::allocator<column_*>_> *__range2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  cols;
  SelectStatement *stmt_local;
  table *this_local;
  
  cols.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__readfds;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
            *)&__range2);
  sVar4 = std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>::size
                    ((vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_> *)
                     (cols.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->second);
  if ((sVar4 == 1) &&
     (ppEVar5 = std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>::operator[]
                          ((vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_> *)
                           (cols.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->second,0),
     (*ppEVar5)->type == kExprStar)) {
    this_01 = &((table *)CONCAT44(in_register_00000034,__nfds))->table_cols;
    __end2 = std::vector<column_*,_std::allocator<column_*>_>::begin(this_01);
    col = (column *)std::vector<column_*,_std::allocator<column_*>_>::end(this_01);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<column_**,_std::vector<column_*,_std::allocator<column_*>_>_>
                                       *)&col), bVar3) {
      ppcVar6 = __gnu_cxx::
                __normal_iterator<column_**,_std::vector<column_*,_std::allocator<column_*>_>_>::
                operator*(&__end2);
      local_58 = *ppcVar6;
      std::make_pair<std::__cxx11::string&,column*&>(&local_80,&local_58->name,&local_58);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
      ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                   *)&__range2,&local_80);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
      ::~pair(&local_80);
      __gnu_cxx::__normal_iterator<column_**,_std::vector<column_*,_std::allocator<column_*>_>_>::
      operator++(&__end2);
    }
  }
  else {
    this_00 = (cols.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage)->second;
    __end2_1 = std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>::begin
                         ((vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_> *)this_00);
    expr = (Expr *)std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>::end
                             ((vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_> *)this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<hsql::Expr_**,_std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>_>
                               *)&expr), bVar3) {
      ppEVar7 = __gnu_cxx::
                __normal_iterator<hsql::Expr_**,_std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>_>
                ::operator*(&__end2_1);
      pEVar1 = *ppEVar7;
      if ((pEVar1->type == kExprLiteralString) || (pEVar1->type == kExprColumnRef)) {
        pcVar2 = pEVar1->name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,pcVar2,(allocator *)((long)&col_1 + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&col_1 + 7));
        local_e0 = getColumn((table *)CONCAT44(in_register_00000034,__nfds),(string *)local_d0);
        bVar3 = local_e0 != (column *)0x0;
        if (bVar3) {
          std::make_pair<std::__cxx11::string&,column*&>(&local_130,&local_e0->name,&local_e0);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
          ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                       *)&__range2,&local_130);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
          ::~pair(&local_130);
        }
        else {
          poVar8 = std::operator<<((ostream *)&std::cout,"Column \'");
          poVar8 = std::operator<<(poVar8,local_d0);
          poVar8 = std::operator<<(poVar8,"\' does not exist in table ");
          getabsName_abi_cxx11_((table *)local_100);
          poVar8 = std::operator<<(poVar8,(string *)local_100);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_100);
          memset(this,0,0x18);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                    *)this);
        }
        local_104 = (uint)!bVar3;
        std::__cxx11::string::~string(local_d0);
        if (local_104 != 0) goto LAB_00135cba;
      }
      __gnu_cxx::
      __normal_iterator<hsql::Expr_**,_std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>_>::
      operator++(&__end2_1);
    }
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
            *)this,(vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                    *)&__range2);
  local_104 = 1;
LAB_00135cba:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
             *)&__range2);
  return (int)this;
}

Assistant:

vector<pair<string, column*>> table::select(hsql::SelectStatement *stmt){

    vector<pair<string, column*>> cols;

    if(stmt->selectList->size() == 1 && (*stmt->selectList)[0]->type == hsql::kExprStar) {    // select *
        for (auto col : table_cols)
            cols.push_back(make_pair(col->name, col));
    }
    else{
        for(hsql::Expr* expr : *stmt->selectList){

            if(expr->type == hsql::kExprLiteralString || expr->type == hsql::kExprColumnRef){   // select C1,C2,...
                string colName = expr->name;
                column *col = getColumn(colName);
                if(col == NULL){
                    cout <<"Column '"<<colName<<"' does not exist in table "<<getabsName()<<endl;
                    return {};
                }else{
                    cols.push_back(make_pair(col->name, col));
                }
            }//else if(expr->type == hsql::kExprLiteralInt){
            //    cols.push_back(make_pair(to_string(expr->ival), (column*)NULL));
            //}
        }
    }
    return cols;

}